

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

Edge * __thiscall
anon_unknown.dwarf_12de04::VertexIdEdgeVectorShape::edge
          (Edge *__return_storage_ptr__,VertexIdEdgeVectorShape *this,int e)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  pointer pVVar4;
  VType VVar5;
  
  ppVar3 = (this->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = ppVar3[e].first;
  pVVar4 = (this->vertices_->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = ppVar3[e].second;
  (__return_storage_ptr__->v0).c_[2] = pVVar4[iVar1].c_[2];
  VVar5 = pVVar4[iVar1].c_[1];
  (__return_storage_ptr__->v0).c_[0] = pVVar4[iVar1].c_[0];
  (__return_storage_ptr__->v0).c_[1] = VVar5;
  VVar5 = pVVar4[iVar2].c_[1];
  (__return_storage_ptr__->v1).c_[0] = pVVar4[iVar2].c_[0];
  (__return_storage_ptr__->v1).c_[1] = VVar5;
  (__return_storage_ptr__->v1).c_[2] = pVVar4[iVar2].c_[2];
  return __return_storage_ptr__;
}

Assistant:

Edge edge(int e) const override {
    return Edge(vertices_[edges_[e].first], vertices_[edges_[e].second]);
  }